

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

pair<pstore::indirect_string,_pstore::index::details::empty_class> * __thiscall
pstore::serialize::
read<std::pair<pstore::indirect_string,pstore::index::details::empty_class>,pstore::serialize::archive::database_reader>
          (pair<pstore::indirect_string,_pstore::index::details::empty_class>
           *__return_storage_ptr__,serialize *this,database_reader *archive)

{
  size_t __nbytes;
  type uninit_buffer;
  undefined1 local_38 [24];
  uint8_t auStack_20 [8];
  
  flood<pstore::serialize::details::aligned_storage<32ul,8ul>::type>((type *)local_38);
  serializer<pstore::indirect_string,_void>::read((int)this,local_38,__nbytes);
  (__return_storage_ptr__->first).field_2 =
       (anon_union_8_2_d34ab9e4_for_indirect_string_3)local_38._16_8_;
  __return_storage_ptr__->field_0x18 = auStack_20[0];
  __return_storage_ptr__->field_0x19 = auStack_20[1];
  __return_storage_ptr__->field_0x1a = auStack_20[2];
  __return_storage_ptr__->field_0x1b = auStack_20[3];
  __return_storage_ptr__->field_0x1c = auStack_20[4];
  __return_storage_ptr__->field_0x1d = auStack_20[5];
  __return_storage_ptr__->field_0x1e = auStack_20[6];
  __return_storage_ptr__->field_0x1f = auStack_20[7];
  (__return_storage_ptr__->first).db_ = (database *)local_38._0_8_;
  *(undefined8 *)&(__return_storage_ptr__->first).is_pointer_ = local_38._8_8_;
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }